

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void set_get_test(void)

{
  bitset_container_t *bitset;
  size_t x_3;
  size_t x_2;
  size_t x_1;
  size_t x;
  bitset_container_t *B;
  bitset_container_t *in_stack_ffffffffffffffd8;
  bitset_container_t *bitset_00;
  char *in_stack_ffffffffffffffe0;
  char *file;
  char *in_stack_ffffffffffffffe8;
  char *expression;
  unsigned_long in_stack_fffffffffffffff0;
  ulong a;
  
  bitset = bitset_container_create();
  _assert_true(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  for (a = 0; a < 0x10000; a = a + 1) {
    bitset_container_get(bitset,(uint16_t)a);
    _assert_true(a,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                 (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  for (expression = (char *)0x0; expression < (char *)0x10000; expression = expression + 3) {
    bitset_container_cardinality(bitset);
    _assert_int_equal(a,(unsigned_long)expression,in_stack_ffffffffffffffe0,
                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    bitset_container_get(bitset,(uint16_t)expression);
    _assert_true(a,expression,in_stack_ffffffffffffffe0,
                 (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    bitset_container_set(bitset,(uint16_t)expression);
    bitset_container_get(bitset,(uint16_t)expression);
    _assert_true(a,expression,in_stack_ffffffffffffffe0,
                 (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    bitset_container_cardinality(bitset);
    _assert_int_equal(a,(unsigned_long)expression,in_stack_ffffffffffffffe0,
                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  for (file = (char *)0x0; file < (char *)0x10000; file = file + 1) {
    bitset_container_get(bitset,(uint16_t)file);
    _assert_int_equal(a,(unsigned_long)expression,file,
                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  bitset_container_cardinality(bitset);
  _assert_int_equal(a,(unsigned_long)expression,file,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                   );
  bitset_container_compute_cardinality(in_stack_ffffffffffffffd8);
  _assert_int_equal(a,(unsigned_long)expression,file,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                   );
  for (bitset_00 = (bitset_container_t *)0x0; bitset_00 < (bitset_container_t *)0x10000;
      bitset_00 = (bitset_container_t *)((long)&bitset_00->cardinality + 3)) {
    bitset_container_remove(bitset,(uint16_t)bitset_00);
  }
  bitset_container_cardinality(bitset);
  _assert_int_equal(a,(unsigned_long)expression,file,(int)((ulong)bitset_00 >> 0x20));
  bitset_container_compute_cardinality(bitset_00);
  _assert_int_equal(a,(unsigned_long)expression,file,(int)((ulong)bitset_00 >> 0x20));
  bitset_container_free((bitset_container_t *)0x102b5f);
  return;
}

Assistant:

DEFINE_TEST(set_get_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_false(bitset_container_get(B, x));
    }

    for (size_t x = 0; x < 1 << 16; x += 3) {
        assert_int_equal(bitset_container_cardinality(B), x / 3);

        assert_false(bitset_container_get(B, x));
        bitset_container_set(B, x);
        assert_true(bitset_container_get(B, x));

        assert_int_equal(bitset_container_cardinality(B), x / 3 + 1);
    }

    for (size_t x = 0; x < 1 << 16; x++) {
        assert_int_equal(bitset_container_get(B, x), (x / 3 * 3 == x));
    }

    assert_int_equal(bitset_container_cardinality(B), (1 << 16) / 3 + 1);
    assert_int_equal(bitset_container_compute_cardinality(B),
                     (1 << 16) / 3 + 1);

    for (size_t x = 0; x < 1 << 16; x += 3) {
        bitset_container_remove(B, x);
    }

    assert_int_equal(bitset_container_cardinality(B), 0);
    assert_int_equal(bitset_container_compute_cardinality(B), 0);

    bitset_container_free(B);
}